

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodemap_edit.cc
# Opt level: O0

void rcg::anon_unknown_0::addNodeToList
               (vector<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                *list,INode *node,int level)

{
  int iVar1;
  ulong uVar2;
  undefined8 *puVar3;
  int in_EDX;
  INode *in_RSI;
  size_t i;
  FeatureList_t feature;
  ICategory *root;
  value_type *in_stack_ffffffffffffff58;
  vector<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
  *in_stack_ffffffffffffff60;
  long *local_70;
  ulong local_58;
  value_vector local_40 [16];
  long *local_30;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = (*(code *)**(undefined8 **)(in_RSI + *(long *)(*(long *)in_RSI + -0x28)))
                    (in_RSI + *(long *)(*(long *)in_RSI + -0x28));
  if (iVar1 != 0) {
    NodeParam::NodeParam((NodeParam *)&stack0xffffffffffffffd8,in_EDX,in_RSI);
    std::
    vector<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
    ::push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    iVar1 = (**(code **)(*(long *)in_RSI + 0xf0))();
    if (iVar1 == 8) {
      if (in_RSI == (INode *)0x0) {
        local_70 = (long *)0x0;
      }
      else {
        local_70 = (long *)__dynamic_cast(in_RSI,&GenApi_3_4::INode::typeinfo,
                                          &GenApi_3_4::ICategory::typeinfo,0xfffffffffffffffe);
      }
      local_30 = local_70;
      if (local_70 != (long *)0x0) {
        GenApi_3_4::value_vector::value_vector(local_40);
        (**(code **)(*local_30 + 0x38))(local_30,local_40);
        in_EDX = in_EDX + 1;
        for (local_58 = 0; uVar2 = GenApi_3_4::value_vector::size(), local_58 < uVar2;
            local_58 = local_58 + 1) {
          puVar3 = (undefined8 *)GenApi_3_4::value_vector::operator[]((ulong)local_40);
          (**(code **)(*(long *)*puVar3 + 0x18))();
          addNodeToList((vector<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                         *)in_RSI,(INode *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                        in_stack_ffffffffffffffe4);
        }
        GenApi_3_4::value_vector::~value_vector(local_40);
      }
    }
  }
  return;
}

Assistant:

void addNodeToList(std::vector<NodeParam> &list, GenApi::INode *node, int level)
{
  if (node->GetAccessMode() != GenApi::NI)
  {
    list.push_back(NodeParam(level, node));

    if (node->GetPrincipalInterfaceType() == GenApi::intfICategory)
    {
      GenApi::ICategory *root=dynamic_cast<GenApi::ICategory *>(node);

      if (root != 0)
      {
        GenApi::FeatureList_t feature;
        root->GetFeatures(feature);

        level++;
        for (size_t i=0; i<feature.size(); i++)
        {
          addNodeToList(list, feature[i]->GetNode(), level);
        }
      }
    }
  }
}